

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O0

void __thiscall cs::token_vargs::~token_vargs(token_vargs *this)

{
  token_vargs *in_RDI;
  
  ~token_vargs(in_RDI);
  token_base::operator_delete((void *)0x1584c2);
  return;
}

Assistant:

token_vargs() = delete;